

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_void_*,_int> pVar3;
  _Self local_38;
  _Self local_30;
  iterator iter;
  string *name_local;
  DescriptorIndex<std::pair<const_void_*,_int>_> *this_local;
  int local_10;
  
  iter._M_node = (_Base_ptr)name;
  local_30._M_node = (_Base_ptr)FindLastLessOrEqual(this,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
       ::end(&this->by_symbol_);
  bVar1 = std::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
             ::operator->(&local_30);
    bVar1 = IsSubSymbol(this,&ppVar2->first,(string *)iter._M_node);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
               ::operator->(&local_30);
      this_local = (DescriptorIndex<std::pair<const_void_*,_int>_> *)(ppVar2->second).first;
      local_10 = (int)*(undefined8 *)&(ppVar2->second).second;
      goto LAB_0054a4cc;
    }
  }
  std::pair<const_void_*,_int>::pair<const_void_*,_int,_true>
            ((pair<const_void_*,_int> *)&this_local);
LAB_0054a4cc:
  pVar3.second = local_10;
  pVar3.first = this_local;
  pVar3._12_4_ = 0;
  return pVar3;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const string& name) {
  typename std::map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name)) ?
         iter->second : Value();
}